

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O0

void __thiscall QSlider::mouseReleaseEvent(QSlider *this,QMouseEvent *ev)

{
  Int IVar1;
  QSliderPrivate *__addr_len;
  QStyle *pQVar2;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  int __fd;
  QEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  SubControl oldPressed;
  QSliderPrivate *d;
  QStyleOptionSlider opt;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff44;
  SubControl repeatTime;
  QSliderPrivate *this_00;
  QEvent *this_01;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_8c;
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RSI;
  __addr_len = d_func((QSlider *)0x683854);
  __fd = (int)in_RSI;
  uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff40);
  __addr = extraout_RDX;
  this_00 = __addr_len;
  if (__addr_len->pressedControl != SC_None) {
    local_8c.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         QSinglePointEvent::buttons((QSinglePointEvent *)CONCAT44(in_stack_ffffffffffffff44,uVar3));
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_8c);
    uVar3 = CONCAT13(IVar1 != 0,(int3)uVar3);
    __addr = extraout_RDX_00;
  }
  if ((char)((uint)uVar3 >> 0x18) == '\0') {
    QEvent::accept(this_01,__fd,__addr,(socklen_t *)__addr_len);
    repeatTime = this_00->pressedControl;
    this_00->pressedControl = SC_None;
    QAbstractSlider::setRepeatAction
              ((QAbstractSlider *)this_01,(SliderAction)((ulong)this_00 >> 0x20),(int)this_00,
               repeatTime);
    if (repeatTime == SC_ComboBoxEditField) {
      QAbstractSlider::setSliderDown((QAbstractSlider *)this_01,SUB81((ulong)this_00 >> 0x38,0));
    }
    memcpy(local_88,&DAT_00b22b00,0x80);
    QStyleOptionSlider::QStyleOptionSlider((QStyleOptionSlider *)0x683917);
    (**(code **)(*(long *)in_RDI + 0x1a8))(in_RDI,local_88);
    QFlags<QStyle::SubControl>::QFlags
              ((QFlags<QStyle::SubControl> *)CONCAT44(repeatTime,uVar3),
               (SubControl)((ulong)in_RDI >> 0x20));
    pQVar2 = QWidget::style(in_RDI);
    (**(code **)(*(long *)pQVar2 + 0xd8))(pQVar2,3,local_88,repeatTime,in_RDI);
    QWidget::update((QWidget *)this_00,(QRect *)CONCAT44(repeatTime,uVar3));
    QStyleOptionSlider::~QStyleOptionSlider((QStyleOptionSlider *)0x68398b);
  }
  else {
    QEvent::ignore(this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSlider::mouseReleaseEvent(QMouseEvent *ev)
{
    Q_D(QSlider);
    if (d->pressedControl == QStyle::SC_None || ev->buttons()) {
        ev->ignore();
        return;
    }
    ev->accept();
    QStyle::SubControl oldPressed = QStyle::SubControl(d->pressedControl);
    d->pressedControl = QStyle::SC_None;
    setRepeatAction(SliderNoAction);
    if (oldPressed == QStyle::SC_SliderHandle)
        setSliderDown(false);
    QStyleOptionSlider opt;
    initStyleOption(&opt);
    opt.subControls = oldPressed;
    update(style()->subControlRect(QStyle::CC_Slider, &opt, oldPressed, this));
}